

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

SizeStatistics * __thiscall
duckdb_parquet::SizeStatistics::operator=(SizeStatistics *this,SizeStatistics *other13)

{
  this->unencoded_byte_array_data_bytes = other13->unencoded_byte_array_data_bytes;
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>,
             &(other13->repetition_level_histogram).super_vector<long,_std::allocator<long>_>);
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->definition_level_histogram).super_vector<long,_std::allocator<long>_>,
             &(other13->definition_level_histogram).super_vector<long,_std::allocator<long>_>);
  this->__isset = other13->__isset;
  return this;
}

Assistant:

SizeStatistics& SizeStatistics::operator=(const SizeStatistics& other13) {
  unencoded_byte_array_data_bytes = other13.unencoded_byte_array_data_bytes;
  repetition_level_histogram = other13.repetition_level_histogram;
  definition_level_histogram = other13.definition_level_histogram;
  __isset = other13.__isset;
  return *this;
}